

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O1

bool __thiscall SQVM::CLASS_OP(SQVM *this,SQObjectPtr *target,SQInteger baseclass)

{
  SQUnsignedInteger *pSVar1;
  SQObjectPtr *obj1;
  SQObjectType SVar2;
  SQObjectPtr *pSVar3;
  SQTable *pSVar4;
  SQClass *pSVar5;
  SQChar *pSVar6;
  bool bVar7;
  
  if (baseclass == -1) {
    pSVar5 = (SQClass *)0x0;
  }
  else {
    pSVar3 = (this->_stack)._vals;
    obj1 = pSVar3 + this->_stackbase + baseclass;
    if (pSVar3[this->_stackbase + baseclass].super_SQObject._type != OT_CLASS) {
      pSVar6 = GetTypeName(obj1);
      Raise_Error(this,"trying to inherit from a %s",pSVar6);
      return false;
    }
    pSVar5 = (obj1->super_SQObject)._unVal.pClass;
  }
  pSVar5 = SQClass::Create(this,pSVar5);
  bVar7 = pSVar5 != (SQClass *)0x0;
  if (bVar7) {
    pSVar4 = (target->super_SQObject)._unVal.pTable;
    SVar2 = (target->super_SQObject)._type;
    (target->super_SQObject)._type = OT_CLASS;
    (target->super_SQObject)._flags = '\0';
    (target->super_SQObject)._unVal.pClass = pSVar5;
    pSVar1 = &(pSVar5->super_SQCollectable).super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
    bVar7 = true;
    if ((SVar2 >> 0x1b & 1) != 0) {
      pSVar1 = &(pSVar4->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 - 1;
      if (*pSVar1 == 0) {
        (*(pSVar4->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])
                  ();
      }
    }
  }
  return bVar7;
}

Assistant:

bool SQVM::CLASS_OP(SQObjectPtr &target,SQInteger baseclass)
{
    SQClass *base = NULL;
    if(baseclass != -1) {
        if (sq_type(_stack._vals[_stackbase+baseclass]) != OT_CLASS) {
            Raise_Error(_SC("trying to inherit from a %s"),GetTypeName(_stack._vals[_stackbase+baseclass]));
            return false;
        }
        base = _class(_stack._vals[_stackbase + baseclass]);
    }
    SQClass *cls = SQClass::Create(this, base);
    if (!cls)
        return false;
    target = cls;
    return true;
}